

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::AttributeFormatTest::DrawAndCheck<double>
          (AttributeFormatTest *this,GLint size,bool normalized)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  long lVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  double dVar14;
  double dVar15;
  string result_str;
  string reference_str;
  double reference [8];
  double result [8];
  double local_258;
  long local_250;
  double local_248;
  double dStack_240;
  double local_238;
  double dStack_230;
  double local_228;
  double dStack_220;
  double local_218;
  double dStack_210;
  double local_208;
  double dStack_200;
  double local_1f8;
  double dStack_1f0;
  undefined1 local_1e8 [16];
  string local_1d8 [32];
  stringstream ss;
  ostringstream local_1b0 [384];
  long lVar6;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  (**(code **)(lVar6 + 0x1680))(this->m_po);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glUseProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x91b);
  (**(code **)(lVar6 + 0xd8))(this->m_vao);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glBindVertexArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x91e);
  uVar10 = 0;
  (**(code **)(lVar6 + 0x30))(0);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glBeginTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x922);
  (**(code **)(lVar6 + 0x538))(0,0,2);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glDrawArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x925);
  (**(code **)(lVar6 + 0x638))();
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glEndTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x928);
  lVar7 = (**(code **)(lVar6 + 0xcf8))(0x8c8e,35000);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glMapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x92c);
  result[6] = 0.0;
  result[7] = 0.0;
  result[4] = 0.0;
  result[5] = 0.0;
  result[2] = 0.0;
  result[3] = 0.0;
  result[0] = 0.0;
  result[1] = 0.0;
  uVar3 = size * 2;
  uVar9 = 0;
  if (0 < (int)uVar3) {
    uVar9 = (ulong)uVar3;
  }
  for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
    result[uVar10] = *(double *)(lVar7 + uVar10 * 8);
  }
  (**(code **)(lVar6 + 0x1670))(0x8c8e);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glUnmapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x936);
  if (normalized) {
    uVar13 = 0x3fb00000;
  }
  else {
    uVar13 = 0x3ff00000;
  }
  local_258 = 0.0;
  local_250 = (ulong)uVar13 << 0x20;
  local_248 = (double)((ulong)uVar13 << 0x20) * 2.0;
  dStack_240 = (double)((ulong)uVar13 << 0x20) * 3.0;
  local_238 = (double)((ulong)uVar13 << 0x20) * 4.0;
  dStack_230 = (double)((ulong)uVar13 << 0x20) * 5.0;
  local_228 = (double)((ulong)uVar13 << 0x20) * 6.0;
  dStack_220 = (double)((ulong)uVar13 << 0x20) * 7.0;
  local_218 = (double)((ulong)uVar13 << 0x20) * 8.0;
  dStack_210 = (double)((ulong)uVar13 << 0x20) * 9.0;
  local_208 = (double)((ulong)uVar13 << 0x20) * 10.0;
  dStack_200 = (double)((ulong)uVar13 << 0x20) * 11.0;
  local_1f8 = (double)((ulong)uVar13 << 0x20) * 12.0;
  dStack_1f0 = (double)((ulong)uVar13 << 0x20) * 13.0;
  dVar15 = (double)((ulong)uVar13 << 0x20) * 15.0;
  local_1e8._8_4_ = SUB84(dVar15,0);
  local_1e8._0_8_ = (double)((ulong)uVar13 << 0x20) * 14.0;
  local_1e8._12_4_ = (int)((ulong)dVar15 >> 0x20);
  reference[6] = 0.0;
  reference[7] = 0.0;
  reference[4] = 0.0;
  reference[5] = 0.0;
  reference[2] = 0.0;
  reference[3] = 0.0;
  reference[0] = 0.0;
  reference[1] = 0.0;
  iVar4 = 0;
  uVar10 = 0;
  if (0 < size) {
    uVar10 = (ulong)(uint)size;
  }
  iVar8 = 0;
  for (iVar11 = 0; uVar12 = uVar10, iVar1 = iVar4, iVar2 = iVar8, iVar11 != 2; iVar11 = iVar11 + 1)
  {
    while (uVar12 != 0) {
      reference[iVar2] = (&local_258)[iVar1] + (&local_258)[size + iVar1];
      uVar12 = uVar12 - 1;
      iVar1 = iVar1 + 1;
      iVar2 = iVar2 + 1;
    }
    iVar8 = iVar8 + size;
    iVar4 = iVar4 + uVar3;
  }
  uVar10 = 0;
  do {
    uVar12 = uVar10;
    if (uVar9 == uVar12) goto LAB_00b24b53;
    dVar14 = reference[uVar12] - result[uVar12];
    dVar15 = -dVar14;
    if (-dVar14 <= dVar14) {
      dVar15 = dVar14;
    }
    uVar10 = uVar12 + 1;
  } while (dVar15 < 0.03125);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reference_str,"[ ",(allocator<char> *)&ss);
  for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::ostream::_M_insert<double>(reference[uVar10]);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append((string *)&reference_str);
    std::__cxx11::string::~string((string *)&result_str);
    std::__cxx11::string::append((char *)&reference_str);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result_str,"[ ",(allocator<char> *)&ss);
  for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::ostream::_M_insert<double>(result[uVar10]);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append((string *)&result_str);
    std::__cxx11::string::~string(local_1d8);
    std::__cxx11::string::append((char *)&result_str);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  _ss = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  std::operator<<((ostream *)local_1b0,"Result vector is equal to ");
  std::operator<<((ostream *)local_1b0,result_str._M_dataplus._M_p);
  std::operator<<((ostream *)local_1b0,", but ");
  std::operator<<((ostream *)local_1b0,reference_str._M_dataplus._M_p);
  std::operator<<((ostream *)local_1b0," was expected.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&ss,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  std::__cxx11::string::~string((string *)&result_str);
  std::__cxx11::string::~string((string *)&reference_str);
LAB_00b24b53:
  return (long)(int)uVar3 <= (long)uVar12;
}

Assistant:

bool AttributeFormatTest::DrawAndCheck(glw::GLint size, bool normalized)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Setup state. */
	gl.useProgram(m_po);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");

	gl.bindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	/* Draw. */
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback call failed.");

	gl.drawArrays(GL_POINTS, 0, 2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays call failed.");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback call failed.");

	/* Result query. */
	T* result_ptr = (T*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer call failed.");

	T result[8] = { 0 };

	for (glw::GLint i = 0; i < size * 2 /* two points */; ++i)
	{
		result[i] = result_ptr[i];
	}

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer call failed.");

	const glw::GLdouble scale = normalized ? (1.0 / 16.0) /* Floating point scalling factor. */ : 1.0;

	const T array_data[16] = { (T)(0.0 * scale),  (T)(1.0 * scale),  (T)(2.0 * scale),  (T)(3.0 * scale),
							   (T)(4.0 * scale),  (T)(5.0 * scale),  (T)(6.0 * scale),  (T)(7.0 * scale),
							   (T)(8.0 * scale),  (T)(9.0 * scale),  (T)(10.0 * scale), (T)(11.0 * scale),
							   (T)(12.0 * scale), (T)(13.0 * scale), (T)(14.0 * scale), (T)(15.0 * scale) };

	T reference[8] = { 0 };

	for (glw::GLint i = 0; i < 2 /* two points */; ++i)
	{
		for (glw::GLint j = 0; j < size /* size components */; ++j)
		{
			reference[i * size + j] = array_data[i * size * 2 + j] + array_data[i * size * 2 + j + size];
		}
	}

	/* Check result and return. */
	for (glw::GLint i = 0; i < size * 2 /* two points */; ++i)
	{
		if (!AttributeFormatTest::compare<T>(reference[i], result[i]))
		{
			std::string reference_str = "[ ";

			for (glw::GLint j = 0; j < size * 2 /* two points */; ++j)
			{
				std::stringstream ss;

				ss << reference[j];

				reference_str.append(ss.str());

				if (j < size * 2 - 1 /* if it is not the last value */)
				{
					reference_str.append(", ");
				}
				else
				{
					reference_str.append(" ]");
				}
			}

			std::string result_str = "[ ";

			for (glw::GLint j = 0; j < size * 2 /* two points */; ++j)
			{
				std::stringstream ss;

				ss << result[j];

				result_str.append(ss.str());

				if (j < size * 2 - 1 /* if it is not the last value */)
				{
					result_str.append(", ");
				}
				else
				{
					result_str.append(" ]");
				}
			}

			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Result vector is equal to "
												<< result_str.c_str() << ", but " << reference_str.c_str()
												<< " was expected." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}